

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_msg.c
# Opt level: O0

pcp_errno parse_response(pcp_recv_msg_t *f)

{
  uint32_t uVar1;
  char *resp_00;
  pcp_response_t *resp;
  pcp_recv_msg_t *f_local;
  
  resp_00 = f->pcp_msg_buffer;
  f->recv_version = (uint)(byte)*resp_00;
  f->recv_result = (uint)(byte)f->pcp_msg_buffer[3];
  *(undefined8 *)((long)&(f->kd).field_5 + 8) = 0;
  *(undefined8 *)((long)&(f->kd).field_5 + 0x10) = 0;
  *(undefined8 *)((f->kd).nonce.n + 2) = 0;
  *(undefined8 *)((long)&(f->kd).field_5 + 4) = 0;
  *(undefined8 *)((long)&(f->kd).pcp_server_ip.__in6_u + 0xc) = 0;
  (f->kd).nonce.n[0] = 0;
  (f->kd).nonce.n[1] = 0;
  *(undefined8 *)((long)&(f->kd).src_ip.__in6_u + 0xc) = 0;
  *(undefined8 *)((long)&(f->kd).pcp_server_ip.__in6_u + 4) = 0;
  *(undefined8 *)&f->kd = 0;
  *(undefined8 *)((long)&(f->kd).src_ip.__in6_u + 4) = 0;
  (f->kd).operation = f->pcp_msg_buffer[1] & 0x7f;
  uVar1 = f->recv_version;
  if (uVar1 == 0) {
    f_local._4_4_ = parse_v0_resp(f,(pcp_response_t *)resp_00);
  }
  else if (uVar1 == 1) {
    f_local._4_4_ = parse_v1_resp(f,(pcp_response_t *)resp_00);
  }
  else if (uVar1 == 2) {
    f_local._4_4_ = parse_v2_resp(f,(pcp_response_t *)resp_00);
  }
  else {
    f_local._4_4_ = PCP_ERR_UNSUP_VERSION;
  }
  return f_local._4_4_;
}

Assistant:

pcp_errno parse_response(pcp_recv_msg_t *f) {
    pcp_response_t *resp = (pcp_response_t *)f->pcp_msg_buffer;

    f->recv_version = resp->ver;
    f->recv_result = resp->result_code;
    memset(&f->kd, 0, sizeof(f->kd));

    f->kd.operation = resp->r_opcode & 0x7f;

    PCP_LOG(PCP_LOGLVL_DEBUG, "parse_response: version: %d", f->recv_version);
    PCP_LOG(PCP_LOGLVL_DEBUG, "parse_response: result: %d", f->recv_result);

    switch (f->recv_version) {
#ifndef PCP_DISABLE_NATPMP
    case 0:
        return parse_v0_resp(f, resp);
        break;
#endif
    case 1:
        return parse_v1_resp(f, resp);
        break;
    case 2:
        return parse_v2_resp(f, resp);
        break;
    }
    return PCP_ERR_UNSUP_VERSION;
}